

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O0

void unruh_G(picnic_instance_t *pp,proof_round_t *prf_round,uint vidx,_Bool include_is)

{
  int iVar1;
  int iVar2;
  byte in_CL;
  long in_RDI;
  uint outputlen;
  uint8_t tmp [64];
  hash_context ctx;
  uint digest_size;
  undefined4 in_stack_fffffffffffffea8;
  undefined2 in_stack_fffffffffffffeac;
  ushort uVar3;
  undefined2 in_stack_fffffffffffffeae;
  undefined2 uVar4;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  
  hash_init_prefix((hash_context *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   CONCAT26(in_stack_fffffffffffffeae,
                            CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)),'\0');
  hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
              (uint8_t *)
              CONCAT26(in_stack_fffffffffffffeae,
                       CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)),0x13968f);
  hash_final((hash_context *)0x139699);
  hash_squeeze((hash_context *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (uint8_t *)
               CONCAT26(in_stack_fffffffffffffeae,
                        CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)),0x1396b1);
  hash_init((hash_context *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
            CONCAT26(in_stack_fffffffffffffeae,
                     CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)));
  hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
              (uint8_t *)
              CONCAT26(in_stack_fffffffffffffeae,
                       CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)),0x1396dc);
  if ((in_CL & 1) != 0) {
    hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                (uint8_t *)
                CONCAT26(in_stack_fffffffffffffeae,
                         CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)),0x139712);
  }
  hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
              (uint8_t *)
              CONCAT26(in_stack_fffffffffffffeae,
                       CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)),0x13973e);
  iVar1 = (uint)*(byte *)(in_RDI + 9) + (uint)*(byte *)(in_RDI + 8);
  if ((in_CL & 1) == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (ushort)*(byte *)(in_RDI + 8);
  }
  uVar4 = 0;
  iVar2 = iVar1 + (uint)uVar3;
  hash_update_uint16_le((hash_context *)CONCAT44(iVar2,iVar1),0);
  hash_final((hash_context *)0x1397a9);
  hash_squeeze((hash_context *)CONCAT44(iVar2,iVar1),
               (uint8_t *)CONCAT26(uVar4,CONCAT24(uVar3,in_stack_fffffffffffffea8)),0x1397cd);
  return;
}

Assistant:

static void unruh_G(const picnic_instance_t* pp, proof_round_t* prf_round, unsigned int vidx,
                    bool include_is) {
  const unsigned int digest_size = pp->digest_size;

  // Hash the seed with H_5, store digest in output
  hash_context ctx;
  hash_init_prefix(&ctx, digest_size, HASH_PREFIX_5);
  hash_update(&ctx, prf_round->seeds[vidx], pp->seed_size);
  hash_final(&ctx);

  uint8_t tmp[MAX_DIGEST_SIZE];
  hash_squeeze(&ctx, tmp, digest_size);
  hash_clear(&ctx);

  // Hash H_5(seed), the view, and the length
  hash_init(&ctx, digest_size);
  hash_update(&ctx, tmp, digest_size);
  if (include_is) {
    hash_update(&ctx, prf_round->input_shares[vidx], pp->input_output_size);
  }
  hash_update(&ctx, prf_round->communicated_bits[vidx], pp->view_size);
  const unsigned int outputlen =
      pp->view_size + pp->input_output_size + (include_is ? pp->input_output_size : 0);
  hash_update_uint16_le(&ctx, outputlen);
  hash_final(&ctx);
  hash_squeeze(&ctx, prf_round->gs[vidx], outputlen);
  hash_clear(&ctx);
}